

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

err_t MetaGet(node *p,dataid Id,void *Data,size_t Size)

{
  long *plVar1;
  err_t eVar2;
  uint *In;
  size_t sVar3;
  uint *puVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  ulong Type;
  
  plVar1 = *(long **)((long)p->VMT + -0x28);
  if (plVar1 != (long *)0x0) {
    lVar7 = *plVar1;
    lVar6 = 0;
    while (lVar6 <= lVar7) {
      uVar5 = (ulong)(lVar6 + lVar7) >> 1;
      if (Id < (ulong)plVar1[uVar5 * 2 + 1]) {
        lVar7 = uVar5 - 1;
      }
      else {
        if (Id <= (ulong)plVar1[uVar5 * 2 + 1]) {
          puVar4 = (uint *)plVar1[uVar5 * 2 + 2];
          uVar8 = *puVar4;
          if ((char)uVar8 == '&') {
            uVar5 = uVar5 - 1;
            puVar4 = (uint *)plVar1[uVar5 * 2 + 2];
            uVar8 = *puVar4;
          }
          else if ((uVar8 & 0xff) == 0x28) {
            eVar2 = (**(code **)(puVar4 + 2))(p,Id,Data,Size);
            return eVar2;
          }
          if ((uVar8 & 0xc0) == 0x40) {
            Type = (ulong)(uVar8 & 0x3f);
            if (*(long *)(puVar4 + 2) < 0) {
              In = (uint *)Node_GetData(p,Id,Type);
              if (In == (uint *)0x0) {
                if (((char)puVar4[4] == '\x02') && ((puVar4[6] & 0x10) != 0)) {
                  return -3;
                }
                memset(Data,0,Size);
                return 0;
              }
            }
            else {
              In = (uint *)((long)&p->FourCC + *(long *)(puVar4 + 2));
            }
            if (Type == 0x18) {
              if ((plVar1[uVar5 * 2 + 3] != Id) || (*(char *)plVar1[uVar5 * 2 + 4] != '&')) {
                __assert_fail("Lookup[Mid+1].Id == Id && Lookup[Mid+1].Meta->Meta==META_PARAM_BIT",
                              "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                              ,0x834,"err_t MetaGet(node *, dataid, void *, size_t)");
              }
              if (Size != 8) {
                return -3;
              }
              *(ulong *)Data = (ulong)((*(uint *)((char *)plVar1[uVar5 * 2 + 4] + 8) & *In) != 0);
            }
            else if ((uVar8 & 0x3f) == 4) {
              tcscpy_s((tchar_t *)Data,Size,(tchar_t *)In);
            }
            else {
              sVar3 = Node_MaxDataSize(p,(ulong)(uVar8 >> 8),Type,0x28);
              if (sVar3 != Size) {
                __assert_fail("Size == DataSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                              ,0x83d,"err_t MetaGet(node *, dataid, void *, size_t)");
              }
              if (Size == 4) {
                *(uint *)Data = *In;
              }
              else {
                memcpy(Data,In,Size);
              }
            }
            return 0;
          }
          __assert_fail("(m->Meta & META_MODE_MASK)==META_MODE_DATA",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                        ,0x818,"err_t MetaGet(node *, dataid, void *, size_t)");
        }
        lVar6 = uVar5 + 1;
      }
    }
  }
  return -4;
}

Assistant:

static err_t MetaGet(node* p,dataid Id,void* Data,size_t Size)
{
    const nodeclass* Class = NodeGetClass(p);
    nodemetalookuphead* Head = Class->MetaGet;
    if (Head)
    {
        nodemetalookup* Lookup = (nodemetalookup*)(Head+1);
        intptr_t Mid;
        intptr_t Lower = 0;
        intptr_t Upper = Head->Upper;

        while (Upper >= Lower)
        {
            Mid = (Upper + Lower) >> 1;

            if (Lookup[Mid].Id>Id)
                Upper = Mid-1;
            else if (Lookup[Mid].Id<Id)
                Lower = Mid+1;
            else
            {
                const nodemeta* m = Lookup[Mid].Meta;
                const void* Ptr;
                datatype Type;

                if (m->Meta == META_PARAM_GET)
                    return ((err_t(*)(node*,dataid,void*,size_t))m->Data)(p,Id,Data,Size);

                if (m->Meta == META_PARAM_BIT)
                    m = Lookup[--Mid].Meta;

                assert((m->Meta & META_MODE_MASK)==META_MODE_DATA);

                Type = (m->Meta & TYPE_MASK);
                if ((intptr_t)m->Data<0)
                {
                    Ptr = Node_GetData(p,Id,Type);
                    if (!Ptr)
                    {
#if defined(CONFIG_CORECDOC)
                        if (m[2].Meta == META_PARAM_DATA_FLAGS && (m[2].Data & DFLAG_NODEFAULT))
#else
                        if (m[1].Meta == META_PARAM_DATA_FLAGS && (m[1].Data & DFLAG_NODEFAULT))
#endif
                            return ERR_INVALID_DATA;

                        memset(Data,0,Size);
                        return ERR_NONE;
                    }
                }
                else
                    Ptr = (const uint8_t*)p + (intptr_t)m->Data;

                if (Type == TYPE_STRING)
                    tcscpy_s(Data,Size/sizeof(tchar_t),(const tchar_t*)Ptr);
                else
                if (Type == TYPE_BOOL_BIT)
                {
                    uint32_t Bit;
                    assert(Lookup[Mid+1].Id == Id && Lookup[Mid+1].Meta->Meta==META_PARAM_BIT);
                    Bit = (uint32_t)Lookup[Mid+1].Meta->Data;
                    if (Size != sizeof(bool_t))
                        return ERR_INVALID_DATA;
                    *(bool_t*)Data = (*(const uint32_t*)Ptr & Bit) != 0;
                }
                else
                {
                    size_t DataSize = Node_MaxDataSize(p,m->Id,Type,META_PARAM_GET);
                    assert(Size == DataSize);
                    if (DataSize != Size)
                        return ERR_INVALID_DATA;

                    if (DataSize==sizeof(int))
                        *(int*)Data = *(const int*)Ptr;
                    else
                        memcpy(Data,Ptr,DataSize);
                }

                return ERR_NONE;
            }
        }
    }
    return ERR_INVALID_PARAM;
}